

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCamera>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomCamera *camera
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  optional<tinyusdz::Interpolation> oVar1;
  pointer pcVar2;
  _Rb_tree_header *p_Var3;
  uint uVar4;
  _Base_ptr p_Var5;
  char *pcVar6;
  undefined8 uVar7;
  size_type sVar8;
  fmt fVar9;
  bool bVar10;
  int iVar11;
  undefined7 extraout_var;
  ostream *poVar12;
  optional<tinyusdz::Interpolation> *poVar13;
  const_iterator cVar14;
  mapped_type *this;
  _Base_ptr p_Var15;
  undefined8 uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  size_type sVar17;
  char *pcVar18;
  anon_struct_8_0_00000001_for___align aVar19;
  Property *pPVar20;
  char cVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_> dst;
  ParseResult ret;
  Attribute *attr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_> pv;
  string attr_type_name;
  ostringstream ss_e;
  undefined8 in_stack_fffffffffffffa38;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *target;
  undefined1 local_5c0 [8];
  anon_struct_8_0_00000001_for___align local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  string local_598;
  TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
  local_578;
  undefined1 local_558 [8];
  undefined1 local_550 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_540;
  anon_struct_8_0_00000001_for___align local_530;
  _Alloc_hider _Stack_528;
  size_type sStack_520;
  bool abStack_518 [16];
  storage_union local_508;
  vtable_type *local_4f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f0;
  TypedAttributeWithFallback<tinyusdz::GeomCamera::StereoRole> *local_4c0;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_> *local_4b8;
  optional<tinyusdz::Interpolation> local_4b0;
  optional<unsigned_int> local_4a8;
  undefined8 local_4a0;
  bool local_498;
  undefined1 local_490 [24];
  string local_478;
  undefined1 local_458 [32];
  fmt local_438;
  undefined7 uStack_437;
  undefined1 auStack_430 [8];
  undefined1 local_428 [16];
  undefined2 local_418;
  undefined1 local_410 [72];
  ios_base local_3c8 [16];
  ios_base local_3b8 [264];
  undefined1 local_2b0 [32];
  undefined1 local_290 [16];
  undefined1 local_280 [48];
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *local_250;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 local_1f8 [32];
  string local_1d8;
  pointer local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string local_158;
  string local_138;
  storage_t<double> local_118 [2];
  undefined1 local_108 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8;
  undefined1 local_b8 [32];
  undefined1 *local_98;
  undefined1 local_90 [24];
  undefined1 local_78 [32];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  local_4f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4f0._M_impl.super__Rb_tree_header._M_header;
  local_4f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4a0._0_1_ = false;
  local_4a0._1_1_ = (storage_t<bool>)0x0;
  local_4a0._2_6_ = 0;
  local_4f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  target = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffa38 >> 0x20),
                    (uint)options->strict_allowedToken_check);
  abStack_518._8_8_ = err;
  local_4f8 = (vtable_type *)warn;
  local_4f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4a8 = (optional<unsigned_int>)camera;
  bVar10 = anon_unknown_0::ReconstructGPrimProperties
                     (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_4f0,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *)properties,&camera->super_GPrim,warn,err,options->strict_allowedToken_check
                     );
  if (bVar10) {
    p_Var15 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_208._8_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    local_4a0._1_7_ = extraout_var;
    local_4a0._0_1_ = p_Var15 == (_Base_ptr)local_208._8_8_;
    if (p_Var15 != (_Base_ptr)local_208._8_8_) {
      local_208._M_allocated_capacity = (long)local_4a8 + 0x2600;
      local_228._24_8_ = (long)local_4a8 + 0x2888;
      local_228._16_8_ = (long)local_4a8 + 0x2378;
      local_228._8_8_ = (long)local_4a8 + 0x3530;
      local_228._0_8_ = (long)local_4a8 + 0x2b10;
      local_248._24_8_ = (long)local_4a8 + 0x2d98;
      local_248._16_8_ = (long)local_4a8 + 0x3020;
      local_248._8_8_ = (long)local_4a8 + 0x32a8;
      local_248.data._0_8_ = (undefined8)((long)local_4a8 + 0x20e0);
      local_4b0 = (optional<tinyusdz::Interpolation>)((long)local_4a8 + 0x1e68);
      local_280._40_8_ = (long)local_4a8 + 0x2078;
      local_280._24_8_ = (long)local_4a8 + 0x2090;
      local_250 = (TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)
                  ((long)local_4a8 + 0x3f10);
      local_280._32_8_ = (long)local_4a8 + 0x3c78;
      local_280._16_8_ = (long)local_4a8 + 0x1970;
      local_4c0 = (TypedAttributeWithFallback<tinyusdz::GeomCamera::StereoRole> *)
                  ((long)local_4a8 + 0x3a40);
      local_4b8 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::GeomCamera::Projection>_>
                   *)((long)local_4a8 + 0x37b8);
      do {
        local_b8._0_8_ = (long)local_b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,*(long *)(p_Var15 + 1),
                   (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
        _local_438 = local_428;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"focalLength","");
        pPVar20 = (Property *)&local_438;
        local_508.dynamic = (Property *)(p_Var15 + 2);
        anon_unknown_0::ParseTypedAttribute<float>
                  ((ParseResult *)local_558,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_4f0,(string *)local_b8,(Property *)(p_Var15 + 2),(string *)&local_438,
                   (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
                   local_208._M_allocated_capacity);
        if ((undefined1 *)_local_438 != local_428) {
          operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
        }
        if (local_b8._0_8_ != (long)local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
        }
        iVar11 = 0;
        if (((ulong)local_558 & 0xfffffffd) == 0) {
          iVar11 = 3;
LAB_0021a2b2:
          bVar10 = false;
        }
        else {
          bVar10 = true;
          if (local_558._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_438,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_438,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"():",3);
            poVar12 = (ostream *)::std::ostream::operator<<((Property *)&local_438,0xeee);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
            pcVar2 = local_5c0 + 0x10;
            local_5c0 = (undefined1  [8])pcVar2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_5c0,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[12],std::__cxx11::string>
                      (&local_598,(fmt *)local_5c0,(string *)"focalLength",(char (*) [12])local_550,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar20)
            ;
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_438,local_598._M_dataplus._M_p,
                                 CONCAT62(local_598._M_string_length._2_6_,
                                          (undefined2)local_598._M_string_length));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_598._M_dataplus._M_p != &local_598.field_2) {
              operator_delete(local_598._M_dataplus._M_p,
                              CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                       local_598.field_2._M_allocated_capacity._0_2_) + 1);
            }
            uVar16 = abStack_518._8_8_;
            if (local_5c0 != (undefined1  [8])pcVar2) {
              operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1));
            }
            if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)uVar16
                != (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)0x0
               ) {
              ::std::__cxx11::stringbuf::str();
              poVar13 = (optional<tinyusdz::Interpolation> *)
                        ::std::__cxx11::string::_M_append(local_5c0,*(ulong *)uVar16);
              oVar1 = (optional<tinyusdz::Interpolation>)(poVar13 + 2);
              if (*poVar13 == oVar1) {
                local_598.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                local_598.field_2._M_allocated_capacity._2_6_ =
                     (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                local_598.field_2._8_2_ = SUB82(poVar13[3],0);
                local_598.field_2._10_6_ = SUB86(poVar13[3],2);
                local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
              }
              else {
                local_598.field_2._M_allocated_capacity._0_2_ = (undefined2)*(undefined8 *)oVar1;
                local_598.field_2._M_allocated_capacity._2_6_ =
                     (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                local_598._M_dataplus._M_p = (pointer)*poVar13;
              }
              local_598._M_string_length._0_2_ = SUB82(poVar13[1],0);
              local_598._M_string_length._2_6_ = SUB86(poVar13[1],2);
              *poVar13 = oVar1;
              poVar13[1].has_value_ = false;
              *(undefined3 *)&poVar13[1].field_0x1 = 0;
              poVar13[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
              poVar13[2].has_value_ = false;
              ::std::__cxx11::string::operator=((string *)uVar16,(string *)&local_598);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_598._M_dataplus._M_p != &local_598.field_2) {
                operator_delete(local_598._M_dataplus._M_p,
                                CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                         local_598.field_2._M_allocated_capacity._0_2_) + 1);
              }
              if (local_5c0 != (undefined1  [8])pcVar2) {
                operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
            ::std::ios_base::~ios_base(local_3c8);
            iVar11 = 1;
            goto LAB_0021a2b2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_550._0_8_ != &aStack_540) {
          operator_delete((void *)local_550._0_8_,(ulong)(aStack_540._M_allocated_capacity + 1));
        }
        if (bVar10) {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,*(long *)(p_Var15 + 1),
                     (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
          _local_438 = local_428;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"focusDistance","")
          ;
          pPVar20 = (Property *)&local_438;
          anon_unknown_0::ParseTypedAttribute<float>
                    ((ParseResult *)local_558,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_4f0,&local_d8,(Property *)local_508.dynamic,(string *)&local_438,
                     (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_228._24_8_);
          if ((undefined1 *)_local_438 != local_428) {
            operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          iVar11 = 0;
          if (((ulong)local_558 & 0xfffffffd) == 0) {
            iVar11 = 3;
LAB_0021a5b8:
            bVar10 = false;
          }
          else {
            bVar10 = true;
            if (local_558._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_438,"[error]",7);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_438,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_438,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"():",3);
              poVar12 = (ostream *)::std::ostream::operator<<((Property *)&local_438,0xef0);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              pcVar2 = local_5c0 + 0x10;
              local_5c0 = (undefined1  [8])pcVar2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_5c0,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[14],std::__cxx11::string>
                        (&local_598,(fmt *)local_5c0,(string *)"focusDistance",
                         (char (*) [14])local_550,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar20);
              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_438,local_598._M_dataplus._M_p,
                                   CONCAT62(local_598._M_string_length._2_6_,
                                            (undefined2)local_598._M_string_length));
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_598._M_dataplus._M_p != &local_598.field_2) {
                operator_delete(local_598._M_dataplus._M_p,
                                CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                         local_598.field_2._M_allocated_capacity._0_2_) + 1);
              }
              uVar16 = abStack_518._8_8_;
              if (local_5c0 != (undefined1  [8])pcVar2) {
                operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1));
              }
              if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                  uVar16 != (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                             *)0x0) {
                ::std::__cxx11::stringbuf::str();
                poVar13 = (optional<tinyusdz::Interpolation> *)
                          ::std::__cxx11::string::_M_append(local_5c0,*(ulong *)uVar16);
                oVar1 = (optional<tinyusdz::Interpolation>)(poVar13 + 2);
                if (*poVar13 == oVar1) {
                  local_598.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                  local_598.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                  local_598.field_2._8_2_ = SUB82(poVar13[3],0);
                  local_598.field_2._10_6_ = SUB86(poVar13[3],2);
                  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
                }
                else {
                  local_598.field_2._M_allocated_capacity._0_2_ = (undefined2)*(undefined8 *)oVar1;
                  local_598.field_2._M_allocated_capacity._2_6_ =
                       (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                  local_598._M_dataplus._M_p = (pointer)*poVar13;
                }
                local_598._M_string_length._0_2_ = SUB82(poVar13[1],0);
                local_598._M_string_length._2_6_ = SUB86(poVar13[1],2);
                *poVar13 = oVar1;
                poVar13[1].has_value_ = false;
                *(undefined3 *)&poVar13[1].field_0x1 = 0;
                poVar13[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                poVar13[2].has_value_ = false;
                ::std::__cxx11::string::operator=((string *)uVar16,(string *)&local_598);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_598._M_dataplus._M_p != &local_598.field_2) {
                  operator_delete(local_598._M_dataplus._M_p,
                                  CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                           local_598.field_2._M_allocated_capacity._0_2_) + 1);
                }
                if (local_5c0 != (undefined1  [8])pcVar2) {
                  operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1));
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
              ::std::ios_base::~ios_base(local_3c8);
              iVar11 = 1;
              goto LAB_0021a5b8;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._0_8_ != &aStack_540) {
            operator_delete((void *)local_550._0_8_,(ulong)(aStack_540._M_allocated_capacity + 1));
          }
          if (bVar10) {
            local_108._16_8_ = &local_e8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_108 + 0x10),*(long *)(p_Var15 + 1),
                       (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
            _local_438 = local_428;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"exposure","");
            pPVar20 = (Property *)&local_438;
            anon_unknown_0::ParseTypedAttribute<float>
                      ((ParseResult *)local_558,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_4f0,(string *)(local_108 + 0x10),(Property *)local_508.dynamic,
                       (string *)&local_438,
                       (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_228._16_8_)
            ;
            if ((undefined1 *)_local_438 != local_428) {
              operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_108._16_8_ != &local_e8) {
              operator_delete((void *)local_108._16_8_,local_e8._M_allocated_capacity + 1);
            }
            iVar11 = 0;
            if (((ulong)local_558 & 0xfffffffd) == 0) {
              iVar11 = 3;
LAB_0021a8be:
              bVar10 = false;
            }
            else {
              bVar10 = true;
              if (local_558._0_4_ != Unmatched) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_438,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_438,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_438,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,"():",3);
                poVar12 = (ostream *)::std::ostream::operator<<((Property *)&local_438,0xef1);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                pcVar2 = local_5c0 + 0x10;
                local_5c0 = (undefined1  [8])pcVar2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_5c0,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[9],std::__cxx11::string>
                          (&local_598,(fmt *)local_5c0,(string *)0x3c597e,(char (*) [9])local_550,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar20);
                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_438,local_598._M_dataplus._M_p,
                                     CONCAT62(local_598._M_string_length._2_6_,
                                              (undefined2)local_598._M_string_length));
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_598._M_dataplus._M_p != &local_598.field_2) {
                  operator_delete(local_598._M_dataplus._M_p,
                                  CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                           local_598.field_2._M_allocated_capacity._0_2_) + 1);
                }
                uVar16 = abStack_518._8_8_;
                if (local_5c0 != (undefined1  [8])pcVar2) {
                  operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1));
                }
                if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                    uVar16 != (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                               *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  poVar13 = (optional<tinyusdz::Interpolation> *)
                            ::std::__cxx11::string::_M_append(local_5c0,*(ulong *)uVar16);
                  oVar1 = (optional<tinyusdz::Interpolation>)(poVar13 + 2);
                  if (*poVar13 == oVar1) {
                    local_598.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                    local_598.field_2._M_allocated_capacity._2_6_ =
                         (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                    local_598.field_2._8_2_ = SUB82(poVar13[3],0);
                    local_598.field_2._10_6_ = SUB86(poVar13[3],2);
                    local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
                  }
                  else {
                    local_598.field_2._M_allocated_capacity._0_2_ = (undefined2)*(undefined8 *)oVar1
                    ;
                    local_598.field_2._M_allocated_capacity._2_6_ =
                         (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                    local_598._M_dataplus._M_p = (pointer)*poVar13;
                  }
                  local_598._M_string_length._0_2_ = SUB82(poVar13[1],0);
                  local_598._M_string_length._2_6_ = SUB86(poVar13[1],2);
                  *poVar13 = oVar1;
                  poVar13[1].has_value_ = false;
                  *(undefined3 *)&poVar13[1].field_0x1 = 0;
                  poVar13[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                  poVar13[2].has_value_ = false;
                  ::std::__cxx11::string::operator=((string *)uVar16,(string *)&local_598);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_598._M_dataplus._M_p != &local_598.field_2) {
                    operator_delete(local_598._M_dataplus._M_p,
                                    CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                             local_598.field_2._M_allocated_capacity._0_2_) + 1);
                  }
                  if (local_5c0 != (undefined1  [8])pcVar2) {
                    operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
                ::std::ios_base::~ios_base(local_3c8);
                iVar11 = 1;
                goto LAB_0021a8be;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_550._0_8_ != &aStack_540) {
              operator_delete((void *)local_550._0_8_,(ulong)(aStack_540._M_allocated_capacity + 1))
              ;
            }
            if (bVar10) {
              local_118[0] = (storage_t<double>)local_108;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_118,*(long *)(p_Var15 + 1),
                         (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
              _local_438 = local_428;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"fStop","");
              pPVar20 = (Property *)&local_438;
              anon_unknown_0::ParseTypedAttribute<float>
                        ((ParseResult *)local_558,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_4f0,(string *)local_118,(Property *)local_508.dynamic,
                         (string *)&local_438,
                         (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)local_228._8_8_
                        );
              if ((undefined1 *)_local_438 != local_428) {
                operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
              }
              if (local_118[0] != (storage_t<double>)local_108) {
                operator_delete((void *)local_118[0],local_108._0_8_ + 1);
              }
              iVar11 = 0;
              if (((ulong)local_558 & 0xfffffffd) == 0) {
                iVar11 = 3;
LAB_0021abc4:
                bVar10 = false;
              }
              else {
                bVar10 = true;
                if (local_558._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_438,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_438,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_438,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_438,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_438,"():",3);
                  poVar12 = (ostream *)::std::ostream::operator<<((Property *)&local_438,0xef2);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                  pcVar2 = local_5c0 + 0x10;
                  local_5c0 = (undefined1  [8])pcVar2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_5c0,"Parsing attribute `{}` failed. Error: {}","");
                  fmt::format<char[6],std::__cxx11::string>
                            (&local_598,(fmt *)local_5c0,(string *)"fStop",(char (*) [6])local_550,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar20);
                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_438,local_598._M_dataplus._M_p,
                                       CONCAT62(local_598._M_string_length._2_6_,
                                                (undefined2)local_598._M_string_length));
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_598._M_dataplus._M_p != &local_598.field_2) {
                    operator_delete(local_598._M_dataplus._M_p,
                                    CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                             local_598.field_2._M_allocated_capacity._0_2_) + 1);
                  }
                  uVar16 = abStack_518._8_8_;
                  if (local_5c0 != (undefined1  [8])pcVar2) {
                    operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1));
                  }
                  if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)
                      uVar16 != (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                 *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    poVar13 = (optional<tinyusdz::Interpolation> *)
                              ::std::__cxx11::string::_M_append(local_5c0,*(ulong *)uVar16);
                    oVar1 = (optional<tinyusdz::Interpolation>)(poVar13 + 2);
                    if (*poVar13 == oVar1) {
                      local_598.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                      local_598.field_2._M_allocated_capacity._2_6_ =
                           (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                      local_598.field_2._8_2_ = SUB82(poVar13[3],0);
                      local_598.field_2._10_6_ = SUB86(poVar13[3],2);
                      local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
                    }
                    else {
                      local_598.field_2._M_allocated_capacity._0_2_ =
                           (undefined2)*(undefined8 *)oVar1;
                      local_598.field_2._M_allocated_capacity._2_6_ =
                           (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                      local_598._M_dataplus._M_p = (pointer)*poVar13;
                    }
                    local_598._M_string_length._0_2_ = SUB82(poVar13[1],0);
                    local_598._M_string_length._2_6_ = SUB86(poVar13[1],2);
                    *poVar13 = oVar1;
                    poVar13[1].has_value_ = false;
                    *(undefined3 *)&poVar13[1].field_0x1 = 0;
                    poVar13[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                    poVar13[2].has_value_ = false;
                    ::std::__cxx11::string::operator=((string *)uVar16,(string *)&local_598);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_598._M_dataplus._M_p != &local_598.field_2) {
                      operator_delete(local_598._M_dataplus._M_p,
                                      CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                               local_598.field_2._M_allocated_capacity._0_2_) + 1);
                    }
                    if (local_5c0 != (undefined1  [8])pcVar2) {
                      operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1)
                                     );
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
                  ::std::ios_base::~ios_base(local_3c8);
                  iVar11 = 1;
                  goto LAB_0021abc4;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._0_8_ != &aStack_540) {
                operator_delete((void *)local_550._0_8_,
                                (ulong)(aStack_540._M_allocated_capacity + 1));
              }
              if (bVar10) {
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_138,*(long *)(p_Var15 + 1),
                           (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
                _local_438 = local_428;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_438,"horizontalAperture","");
                pPVar20 = (Property *)&local_438;
                anon_unknown_0::ParseTypedAttribute<float>
                          ((ParseResult *)local_558,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_4f0,&local_138,(Property *)local_508.dynamic,
                           (string *)&local_438,
                           (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
                           local_228._0_8_);
                if ((undefined1 *)_local_438 != local_428) {
                  operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  local_138.field_2._M_allocated_capacity + 1);
                }
                iVar11 = 0;
                if (((ulong)local_558 & 0xfffffffd) == 0) {
                  iVar11 = 3;
LAB_0021aeca:
                  bVar10 = false;
                }
                else {
                  bVar10 = true;
                  if (local_558._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_438,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_438,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_438,":",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_438,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_438,"():",3);
                    poVar12 = (ostream *)::std::ostream::operator<<((Property *)&local_438,0xef4);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                    pcVar2 = local_5c0 + 0x10;
                    local_5c0 = (undefined1  [8])pcVar2;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_5c0,"Parsing attribute `{}` failed. Error: {}","");
                    fmt::format<char[19],std::__cxx11::string>
                              (&local_598,(fmt *)local_5c0,(string *)"horizontalAperture",
                               (char (*) [19])local_550,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar20);
                    poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_438,local_598._M_dataplus._M_p,
                                         CONCAT62(local_598._M_string_length._2_6_,
                                                  (undefined2)local_598._M_string_length));
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_598._M_dataplus._M_p != &local_598.field_2) {
                      operator_delete(local_598._M_dataplus._M_p,
                                      CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                               local_598.field_2._M_allocated_capacity._0_2_) + 1);
                    }
                    uVar16 = abStack_518._8_8_;
                    if (local_5c0 != (undefined1  [8])pcVar2) {
                      operator_delete((void *)local_5c0,(ulong)(local_5b0._M_allocated_capacity + 1)
                                     );
                    }
                    if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                         *)uVar16 !=
                        (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                         *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      poVar13 = (optional<tinyusdz::Interpolation> *)
                                ::std::__cxx11::string::_M_append(local_5c0,*(ulong *)uVar16);
                      oVar1 = (optional<tinyusdz::Interpolation>)(poVar13 + 2);
                      if (*poVar13 == oVar1) {
                        local_598.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1;
                        local_598.field_2._M_allocated_capacity._2_6_ =
                             (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                        local_598.field_2._8_2_ = SUB82(poVar13[3],0);
                        local_598.field_2._10_6_ = SUB86(poVar13[3],2);
                        local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
                      }
                      else {
                        local_598.field_2._M_allocated_capacity._0_2_ =
                             (undefined2)*(undefined8 *)oVar1;
                        local_598.field_2._M_allocated_capacity._2_6_ =
                             (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                        local_598._M_dataplus._M_p = (pointer)*poVar13;
                      }
                      local_598._M_string_length._0_2_ = SUB82(poVar13[1],0);
                      local_598._M_string_length._2_6_ = SUB86(poVar13[1],2);
                      *poVar13 = oVar1;
                      poVar13[1].has_value_ = false;
                      *(undefined3 *)&poVar13[1].field_0x1 = 0;
                      poVar13[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                      poVar13[2].has_value_ = false;
                      ::std::__cxx11::string::operator=((string *)uVar16,(string *)&local_598);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_598._M_dataplus._M_p != &local_598.field_2) {
                        operator_delete(local_598._M_dataplus._M_p,
                                        CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                                 local_598.field_2._M_allocated_capacity._0_2_) + 1)
                        ;
                      }
                      if (local_5c0 != (undefined1  [8])pcVar2) {
                        operator_delete((void *)local_5c0,
                                        (ulong)(local_5b0._M_allocated_capacity + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
                    ::std::ios_base::~ios_base(local_3c8);
                    iVar11 = 1;
                    goto LAB_0021aeca;
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_550._0_8_ != &aStack_540) {
                  operator_delete((void *)local_550._0_8_,
                                  (ulong)(aStack_540._M_allocated_capacity + 1));
                }
                if (bVar10) {
                  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_158,*(long *)(p_Var15 + 1),
                             (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
                  _local_438 = local_428;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_438,"horizontalApertureOffset","");
                  pPVar20 = (Property *)&local_438;
                  anon_unknown_0::ParseTypedAttribute<float>
                            ((ParseResult *)local_558,
                             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_4f0,&local_158,(Property *)local_508.dynamic,
                             (string *)&local_438,
                             (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
                             local_248._24_8_);
                  if ((undefined1 *)_local_438 != local_428) {
                    operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._M_dataplus._M_p != &local_158.field_2) {
                    operator_delete(local_158._M_dataplus._M_p,
                                    local_158.field_2._M_allocated_capacity + 1);
                  }
                  iVar11 = 0;
                  if (((ulong)local_558 & 0xfffffffd) == 0) {
                    iVar11 = 3;
LAB_0021b1d0:
                    bVar10 = false;
                  }
                  else {
                    bVar10 = true;
                    if (local_558._0_4_ != Unmatched) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_438,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_438,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_438,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_438,"ReconstructPrim",0xf);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_438,"():",3);
                      poVar12 = (ostream *)::std::ostream::operator<<((Property *)&local_438,0xef6);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                      pcVar2 = local_5c0 + 0x10;
                      local_5c0 = (undefined1  [8])pcVar2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_5c0,"Parsing attribute `{}` failed. Error: {}","");
                      fmt::format<char[25],std::__cxx11::string>
                                (&local_598,(fmt *)local_5c0,(string *)"horizontalApertureOffset",
                                 (char (*) [25])local_550,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pPVar20);
                      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&local_438,local_598._M_dataplus._M_p,
                                           CONCAT62(local_598._M_string_length._2_6_,
                                                    (undefined2)local_598._M_string_length));
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_598._M_dataplus._M_p != &local_598.field_2) {
                        operator_delete(local_598._M_dataplus._M_p,
                                        CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                                 local_598.field_2._M_allocated_capacity._0_2_) + 1)
                        ;
                      }
                      uVar16 = abStack_518._8_8_;
                      if (local_5c0 != (undefined1  [8])pcVar2) {
                        operator_delete((void *)local_5c0,
                                        (ulong)(local_5b0._M_allocated_capacity + 1));
                      }
                      if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                           *)uVar16 !=
                          (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                           *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        poVar13 = (optional<tinyusdz::Interpolation> *)
                                  ::std::__cxx11::string::_M_append(local_5c0,*(ulong *)uVar16);
                        oVar1 = (optional<tinyusdz::Interpolation>)(poVar13 + 2);
                        if (*poVar13 == oVar1) {
                          local_598.field_2._M_allocated_capacity._0_2_ = (undefined2)*(long *)oVar1
                          ;
                          local_598.field_2._M_allocated_capacity._2_6_ =
                               (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                          local_598.field_2._8_2_ = SUB82(poVar13[3],0);
                          local_598.field_2._10_6_ = SUB86(poVar13[3],2);
                          local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
                        }
                        else {
                          local_598.field_2._M_allocated_capacity._0_2_ =
                               (undefined2)*(undefined8 *)oVar1;
                          local_598.field_2._M_allocated_capacity._2_6_ =
                               (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                          local_598._M_dataplus._M_p = (pointer)*poVar13;
                        }
                        local_598._M_string_length._0_2_ = SUB82(poVar13[1],0);
                        local_598._M_string_length._2_6_ = SUB86(poVar13[1],2);
                        *poVar13 = oVar1;
                        poVar13[1].has_value_ = false;
                        *(undefined3 *)&poVar13[1].field_0x1 = 0;
                        poVar13[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                        poVar13[2].has_value_ = false;
                        ::std::__cxx11::string::operator=((string *)uVar16,(string *)&local_598);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_598._M_dataplus._M_p != &local_598.field_2) {
                          operator_delete(local_598._M_dataplus._M_p,
                                          CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                                   local_598.field_2._M_allocated_capacity._0_2_) +
                                          1);
                        }
                        if (local_5c0 != (undefined1  [8])pcVar2) {
                          operator_delete((void *)local_5c0,
                                          (ulong)(local_5b0._M_allocated_capacity + 1));
                        }
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
                      ::std::ios_base::~ios_base(local_3c8);
                      iVar11 = 1;
                      goto LAB_0021b1d0;
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_550._0_8_ != &aStack_540) {
                    operator_delete((void *)local_550._0_8_,
                                    (ulong)(aStack_540._M_allocated_capacity + 1));
                  }
                  if (bVar10) {
                    local_178._M_allocated_capacity = (size_type)&local_168;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_178,*(long *)(p_Var15 + 1),
                               (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
                    _local_438 = local_428;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_438,"verticalAperture","");
                    pPVar20 = (Property *)&local_438;
                    anon_unknown_0::ParseTypedAttribute<float>
                              ((ParseResult *)local_558,
                               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_4f0,(string *)&local_178,(Property *)local_508.dynamic,
                               (string *)&local_438,
                               (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
                               local_248._16_8_);
                    if ((undefined1 *)_local_438 != local_428) {
                      operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_allocated_capacity != &local_168) {
                      operator_delete((void *)local_178._M_allocated_capacity,
                                      local_168._M_allocated_capacity + 1);
                    }
                    iVar11 = 0;
                    if (((ulong)local_558 & 0xfffffffd) == 0) {
                      iVar11 = 3;
LAB_0021b4d6:
                      bVar10 = false;
                    }
                    else {
                      bVar10 = true;
                      if (local_558._0_4_ != Unmatched) {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_438,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_438,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                   ,0x5a);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_438,":",1);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_438,"ReconstructPrim",0xf);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_438,"():",3);
                        poVar12 = (ostream *)
                                  ::std::ostream::operator<<((Property *)&local_438,0xef8);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                        pcVar2 = local_5c0 + 0x10;
                        local_5c0 = (undefined1  [8])pcVar2;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_5c0,"Parsing attribute `{}` failed. Error: {}",""
                                  );
                        fmt::format<char[17],std::__cxx11::string>
                                  (&local_598,(fmt *)local_5c0,(string *)"verticalAperture",
                                   (char (*) [17])local_550,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)pPVar20);
                        poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&local_438,local_598._M_dataplus._M_p,
                                             CONCAT62(local_598._M_string_length._2_6_,
                                                      (undefined2)local_598._M_string_length));
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_598._M_dataplus._M_p != &local_598.field_2) {
                          operator_delete(local_598._M_dataplus._M_p,
                                          CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                                   local_598.field_2._M_allocated_capacity._0_2_) +
                                          1);
                        }
                        uVar16 = abStack_518._8_8_;
                        if (local_5c0 != (undefined1  [8])pcVar2) {
                          operator_delete((void *)local_5c0,
                                          (ulong)(local_5b0._M_allocated_capacity + 1));
                        }
                        if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                             *)uVar16 !=
                            (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                             *)0x0) {
                          ::std::__cxx11::stringbuf::str();
                          poVar13 = (optional<tinyusdz::Interpolation> *)
                                    ::std::__cxx11::string::_M_append(local_5c0,*(ulong *)uVar16);
                          oVar1 = (optional<tinyusdz::Interpolation>)(poVar13 + 2);
                          if (*poVar13 == oVar1) {
                            local_598.field_2._M_allocated_capacity._0_2_ =
                                 (undefined2)*(long *)oVar1;
                            local_598.field_2._M_allocated_capacity._2_6_ =
                                 (undefined6)((ulong)*(long *)oVar1 >> 0x10);
                            local_598.field_2._8_2_ = SUB82(poVar13[3],0);
                            local_598.field_2._10_6_ = SUB86(poVar13[3],2);
                            local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
                          }
                          else {
                            local_598.field_2._M_allocated_capacity._0_2_ =
                                 (undefined2)*(undefined8 *)oVar1;
                            local_598.field_2._M_allocated_capacity._2_6_ =
                                 (undefined6)((ulong)*(undefined8 *)oVar1 >> 0x10);
                            local_598._M_dataplus._M_p = (pointer)*poVar13;
                          }
                          local_598._M_string_length._0_2_ = SUB82(poVar13[1],0);
                          local_598._M_string_length._2_6_ = SUB86(poVar13[1],2);
                          *poVar13 = oVar1;
                          poVar13[1].has_value_ = false;
                          *(undefined3 *)&poVar13[1].field_0x1 = 0;
                          poVar13[1].contained = (storage_t<tinyusdz::Interpolation>)0x0;
                          poVar13[2].has_value_ = false;
                          ::std::__cxx11::string::operator=((string *)uVar16,(string *)&local_598);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_598._M_dataplus._M_p != &local_598.field_2) {
                            operator_delete(local_598._M_dataplus._M_p,
                                            CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                                     local_598.field_2._M_allocated_capacity._0_2_)
                                            + 1);
                          }
                          if (local_5c0 != (undefined1  [8])pcVar2) {
                            operator_delete((void *)local_5c0,
                                            (ulong)(local_5b0._M_allocated_capacity + 1));
                          }
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438);
                        ::std::ios_base::~ios_base(local_3c8);
                        iVar11 = 1;
                        goto LAB_0021b4d6;
                      }
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_550._0_8_ != &aStack_540) {
                      operator_delete((void *)local_550._0_8_,
                                      (ulong)(aStack_540._M_allocated_capacity + 1));
                    }
                    if (bVar10) {
                      local_198._0_8_ = local_198 + 0x10;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)local_198,*(long *)(p_Var15 + 1),
                                 (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1));
                      _local_438 = local_428;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_438,"verticalApertureOffset","");
                      pPVar20 = (Property *)&local_438;
                      anon_unknown_0::ParseTypedAttribute<float>
                                ((ParseResult *)local_558,
                                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_4f0,(string *)local_198,(Property *)local_508.dynamic,
                                 (string *)&local_438,
                                 (TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)
                                 local_248._8_8_);
                      if ((undefined1 *)_local_438 != local_428) {
                        operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
                      }
                      if ((pointer)local_198._0_8_ != (pointer)(local_198 + 0x10)) {
                        operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
                      }
                      iVar11 = 0;
                      if (((ulong)local_558 & 0xfffffffd) == 0) {
                        iVar11 = 3;
LAB_0021b79b:
                        bVar10 = false;
                      }
                      else {
                        bVar10 = true;
                        if (local_558._0_4_ != Unmatched) {
                          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_438);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_438,"[error]",7);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_438,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     ,0x5a);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_438,":",1);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_438,"ReconstructPrim",0xf);
                          ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_438,"():",3);
                          poVar12 = (ostream *)
                                    ::std::ostream::operator<<((Property *)&local_438,0xefa);
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                          pcVar2 = local_5c0 + 0x10;
                          local_5c0 = (undefined1  [8])pcVar2;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_5c0,"Parsing attribute `{}` failed. Error: {}",
                                     "");
                          fmt::format<char[23],std::__cxx11::string>
                                    (&local_598,(fmt *)local_5c0,(string *)"verticalApertureOffset",
                                     (char (*) [23])local_550,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)pPVar20);
                          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&local_438,local_598._M_dataplus._M_p,
                                               CONCAT62(local_598._M_string_length._2_6_,
                                                        (undefined2)local_598._M_string_length));
                          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_598._M_dataplus._M_p != &local_598.field_2) {
                            operator_delete(local_598._M_dataplus._M_p,
                                            CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                                     local_598.field_2._M_allocated_capacity._0_2_)
                                            + 1);
                          }
                          uVar16 = abStack_518._8_8_;
                          if (local_5c0 != (undefined1  [8])pcVar2) {
                            operator_delete((void *)local_5c0,
                                            (ulong)(local_5b0._M_allocated_capacity + 1));
                          }
                          if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                               *)uVar16 !=
                              (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                               *)0x0) {
                            ::std::__cxx11::stringbuf::str();
                            ::std::operator+(&local_598,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_5c0,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)uVar16);
                            ::std::__cxx11::string::operator=((string *)uVar16,(string *)&local_598)
                            ;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_598._M_dataplus._M_p != &local_598.field_2) {
                              operator_delete(local_598._M_dataplus._M_p,
                                              CONCAT62(local_598.field_2._M_allocated_capacity._2_6_
                                                       ,local_598.field_2._M_allocated_capacity.
                                                        _0_2_) + 1);
                            }
                            if (local_5c0 != (undefined1  [8])pcVar2) {
                              operator_delete((void *)local_5c0,
                                              (ulong)(local_5b0._M_allocated_capacity + 1));
                            }
                          }
                          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_438)
                          ;
                          ::std::ios_base::~ios_base(local_3c8);
                          iVar11 = 1;
                          goto LAB_0021b79b;
                        }
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_550._0_8_ != &aStack_540) {
                        operator_delete((void *)local_550._0_8_,
                                        (ulong)(aStack_540._M_allocated_capacity + 1));
                      }
                      if (bVar10) {
                        local_1b8[0] = (pointer)local_1a8;
                        ::std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_1b8,*(long *)(p_Var15 + 1),
                                   (long)&(p_Var15[1]._M_parent)->_M_color + *(long *)(p_Var15 + 1))
                        ;
                        _local_438 = local_428;
                        ::std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_438,"clippingRange","");
                        uVar16 = local_508.dynamic;
                        pPVar20 = (Property *)&local_438;
                        (anonymous_namespace)::ParseTypedAttribute<std::array<float,2ul>>
                                  ((ParseResult *)local_558,(_anonymous_namespace_ *)&local_4f0,
                                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_1b8,(string *)local_508.dynamic,(Property *)&local_438,
                                   (string *)local_248.data._0_8_,target);
                        if ((undefined1 *)_local_438 != local_428) {
                          operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
                        }
                        if (local_1b8[0] != (pointer)local_1a8) {
                          operator_delete(local_1b8[0],(ulong)(local_1a8._0_8_ + 1));
                        }
                        iVar11 = 0;
                        if (((ulong)local_558 & 0xfffffffd) == 0) {
                          iVar11 = 3;
LAB_0021ba60:
                          bVar10 = false;
                        }
                        else {
                          bVar10 = true;
                          if (local_558._0_4_ != Unmatched) {
                            ::std::__cxx11::ostringstream::ostringstream
                                      ((ostringstream *)&local_438);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_438,"[error]",7);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_438,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                       ,0x5a);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_438,":",1);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_438,"ReconstructPrim",0xf);
                            ::std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&local_438,"():",3);
                            poVar12 = (ostream *)
                                      ::std::ostream::operator<<((Property *)&local_438,0xefc);
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                            pcVar2 = local_5c0 + 0x10;
                            local_5c0 = (undefined1  [8])pcVar2;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_5c0,
                                       "Parsing attribute `{}` failed. Error: {}","");
                            uVar16 = local_550;
                            fmt::format<char[14],std::__cxx11::string>
                                      (&local_598,(fmt *)local_5c0,(string *)"clippingRange",
                                       (char (*) [14])uVar16,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)pPVar20);
                            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&local_438,local_598._M_dataplus._M_p,
                                                 CONCAT62(local_598._M_string_length._2_6_,
                                                          (undefined2)local_598._M_string_length));
                            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_598._M_dataplus._M_p != &local_598.field_2) {
                              operator_delete(local_598._M_dataplus._M_p,
                                              CONCAT62(local_598.field_2._M_allocated_capacity._2_6_
                                                       ,local_598.field_2._M_allocated_capacity.
                                                        _0_2_) + 1);
                            }
                            uVar7 = abStack_518._8_8_;
                            if (local_5c0 != (undefined1  [8])pcVar2) {
                              operator_delete((void *)local_5c0,
                                              (ulong)(local_5b0._M_allocated_capacity + 1));
                            }
                            if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                 *)uVar7 !=
                                (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                 *)0x0) {
                              ::std::__cxx11::stringbuf::str();
                              ::std::operator+(&local_598,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_5c0,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)uVar7);
                              ::std::__cxx11::string::operator=
                                        ((string *)uVar7,(string *)&local_598);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_598._M_dataplus._M_p != &local_598.field_2) {
                                operator_delete(local_598._M_dataplus._M_p,
                                                CONCAT62(local_598.field_2._M_allocated_capacity.
                                                         _2_6_,local_598.field_2.
                                                               _M_allocated_capacity._0_2_) + 1);
                              }
                              if (local_5c0 != (undefined1  [8])pcVar2) {
                                operator_delete((void *)local_5c0,
                                                (ulong)(local_5b0._M_allocated_capacity + 1));
                              }
                            }
                            ::std::__cxx11::ostringstream::~ostringstream
                                      ((ostringstream *)&local_438);
                            ::std::ios_base::~ios_base(local_3c8);
                            iVar11 = 1;
                            goto LAB_0021ba60;
                          }
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_550._0_8_ != &aStack_540) {
                          operator_delete((void *)local_550._0_8_,
                                          (ulong)(aStack_540._M_allocated_capacity + 1));
                        }
                        if (bVar10) {
                          local_290._0_8_ = local_280;
                          ::std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_290,*(long *)(p_Var15 + 1),
                                     (long)&(p_Var15[1]._M_parent)->_M_color +
                                     *(long *)(p_Var15 + 1));
                          local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
                          ::std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)(local_490 + 0x18),"clippingPlanes","");
                          uVar7 = local_290._8_8_;
                          sVar8 = local_478._M_string_length;
                          local_5b8 = (anon_struct_8_0_00000001_for___align)((long)local_5c0 + 0x18)
                          ;
                          local_5b0._M_allocated_capacity = 0;
                          local_5b0._M_local_buf[8] = '\0';
                          __n = local_290._8_8_;
                          if (local_478._M_string_length < (ulong)local_290._8_8_) {
                            __n = local_478._M_string_length;
                          }
                          if (__n == 0) {
                            bVar10 = true;
                          }
                          else {
                            iVar11 = bcmp((void *)local_290._0_8_,local_478._M_dataplus._M_p,__n);
                            bVar10 = iVar11 == 0;
                          }
                          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT71((int7)((ulong)uVar16 >> 8),uVar7 != sVar8);
                          if ((bool)(bVar10 ^ 1U | uVar7 != sVar8)) {
                            local_5c0._0_4_ = 1;
                          }
                          else {
                            if (((ulong)p_Var15[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000
                               ) {
                              local_5c0._0_4_ = 7;
                              local_558 = (undefined1  [8])(local_550 + 8);
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_558,
                                         "Property `{}` must be Attribute, but declared as Relationship."
                                         ,"");
                              fmt::format<std::__cxx11::string>
                                        ((string *)&local_438,(fmt *)local_558,
                                         (string *)(local_490 + 0x18),args);
                              ::std::__cxx11::string::operator=
                                        ((string *)(local_5c0 + 8),(string *)&local_438);
                              if ((undefined1 *)_local_438 != local_428) {
                                operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
                              }
                              if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                operator_delete((void *)local_558,(ulong)(local_550._8_8_ + 1));
                              }
                            }
                            if (p_Var15[6]._M_left != p_Var15[6]._M_parent) {
                              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::
                              operator=((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                        local_280._40_8_,
                                        (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                        &p_Var15[6]._M_parent);
                              local_5c0 = (undefined1  [8])((ulong)local_5c0 & 0xffffffff00000000);
                            }
                            Attribute::type_name_abi_cxx11_
                                      ((string *)local_458,(Attribute *)local_508.dynamic);
                            tinyusdz::value::
                            TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                            ::type_name_abi_cxx11_();
                            if (auStack_430 == (undefined1  [8])local_458._8_8_) {
                              if ((optional<tinyusdz::Interpolation>)auStack_430 ==
                                  (optional<tinyusdz::Interpolation>)0x0) {
                                bVar10 = true;
                              }
                              else {
                                iVar11 = bcmp((void *)_local_438,(void *)local_458._0_8_,
                                              (size_t)auStack_430);
                                bVar10 = iVar11 == 0;
                              }
                            }
                            else {
                              bVar10 = false;
                            }
                            bVar24 = true;
                            if (!bVar10) {
                              tinyusdz::value::
                              TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                              ::underlying_type_name_abi_cxx11_();
                              if (local_90._0_8_ == local_458._8_8_) {
                                if ((optional<tinyusdz::Interpolation>)local_90._0_8_ !=
                                    (optional<tinyusdz::Interpolation>)0x0) {
                                  iVar11 = bcmp(local_98,(void *)local_458._0_8_,local_90._0_8_);
                                  bVar24 = iVar11 == 0;
                                }
                              }
                              else {
                                bVar24 = false;
                              }
                            }
                            if ((!bVar10) && (local_98 != local_90 + 8)) {
                              operator_delete(local_98,local_90._8_8_ + 1);
                            }
                            if ((undefined1 *)_local_438 != local_428) {
                              operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
                            }
                            if (bVar24) {
                              iVar11 = *(int *)((long)&p_Var15[0x17]._M_parent + 4);
                              if (iVar11 != 1) {
                                if (iVar11 == 0) {
                                  *(bool *)((long)local_4a8 + 0x2070) = true;
                                  AttrMetas::operator=
                                            ((AttrMetas *)local_4b0,(AttrMetas *)(p_Var15 + 7));
                                  __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(local_490 + 0x18);
LAB_0021c413:
                                  ::std::
                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  ::_M_insert_unique<std::__cxx11::string_const&>
                                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                              *)&local_4f0,__v);
                                  local_5c0 = (undefined1  [8])
                                              ((ulong)local_5c0 & 0xffffffff00000000);
                                }
                                else {
                                  pPVar20 = (Property *)0x25;
                                  ::std::__cxx11::string::_M_replace
                                            ((ulong)(local_5c0 + 8),0,
                                             (char *)local_5b0._M_allocated_capacity,0x3bcc94);
                                  local_5c0._0_4_ = 8;
                                }
                                goto LAB_0021c420;
                              }
                              if (p_Var15[5]._M_left == p_Var15[5]._M_parent) {
                                if (p_Var15[4]._M_right == (_Base_ptr)0x0) {
                                  bVar10 = false;
                                }
                                else {
                                  iVar11 = (**(code **)p_Var15[4]._M_right)();
                                  bVar10 = iVar11 == 4;
                                }
                                if ((bVar10) || ((p_Var15[5]._M_color & _S_black) != _S_red)) {
                                  *(bool *)((long)local_4a8 + 0x20d8) = true;
                                }
                              }
                              if (((char)p_Var15[5]._M_color == _S_red) &&
                                 ((((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                                    (iVar11 = (**(code **)p_Var15[4]._M_right)(), iVar11 == 0)) ||
                                   ((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                                    (iVar11 = (**(code **)p_Var15[4]._M_right)(), iVar11 == 1)))) &&
                                  (p_Var15[5]._M_left == p_Var15[5]._M_parent)))) {
                                bVar10 = true;
                                bVar24 = false;
                              }
                              else {
                                local_578._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                                local_578._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                                local_578._dirty = false;
                                local_578._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                local_578._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                                local_578._samples.
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                                local_598.field_2._M_allocated_capacity._0_2_ = 0;
                                local_598.field_2._M_allocated_capacity._2_6_ = 0;
                                local_598.field_2._8_2_ = 0;
                                local_598._M_dataplus._M_p = (pointer)0x0;
                                local_598._M_string_length._0_2_ = 0;
                                local_598._M_string_length._2_6_ = 0;
                                bVar10 = primvar::PrimVar::is_valid
                                                   ((PrimVar *)&p_Var15[4]._M_parent);
                                if (bVar10) {
                                  if (((char)p_Var15[5]._M_color == _S_red) &&
                                     (((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                                       (iVar11 = (**(code **)p_Var15[4]._M_right)(), iVar11 == 0))
                                      || ((p_Var15[4]._M_right != (_Base_ptr)0x0 &&
                                          (iVar11 = (**(code **)p_Var15[4]._M_right)(), iVar11 == 1)
                                          ))))) {
                                    cVar21 = '\0';
                                  }
                                  else {
                                    primvar::PrimVar::
                                    get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                                              ((optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                                *)local_2b0,(PrimVar *)&p_Var15[4]._M_parent);
                                    cVar21 = local_2b0[0];
                                    local_498 = local_2b0[0];
                                    if (local_2b0[0] == true) {
                                      local_490._0_8_ = local_2b0._8_8_;
                                      local_490._8_8_ = local_2b0._16_8_;
                                      local_490._16_8_ = local_2b0._24_8_;
                                      local_2b0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                                      local_2b0._16_8_ = 0;
                                      local_2b0._24_8_ = 0;
                                      ::std::
                                      vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                      ::operator=((
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)&local_598,
                                                  (
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)local_490);
                                      local_598.field_2._8_2_ = 1;
                                    }
                                    if ((local_498 == true) &&
                                       ((anon_struct_8_0_00000001_for___align)local_490._0_8_ !=
                                        (anon_struct_8_0_00000001_for___align)0x0)) {
                                      operator_delete((void *)local_490._0_8_,
                                                      local_490._16_8_ - local_490._0_8_);
                                    }
                                  }
                                  if (p_Var15[5]._M_left == p_Var15[5]._M_parent) {
                                    if (cVar21 == '\0') goto LAB_0021bfe7;
                                  }
                                  else {
                                    local_508._12_4_ =
                                         (undefined4)
                                         CONCAT71((int7)((ulong)p_Var15[5]._M_left >> 8),
                                                  local_558[0]);
                                    lVar22 = 0;
                                    uVar23 = 0;
                                    do {
                                      if ((char)p_Var15[6]._M_color == _S_black) {
                                        tinyusdz::value::TimeSamples::update
                                                  ((TimeSamples *)&p_Var15[5]._M_parent);
                                      }
                                      p_Var5 = p_Var15[5]._M_parent;
                                      if (*(char *)((long)&p_Var5[1]._M_color + lVar22) == '\x01') {
                                        TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                        ::add_blocked_sample
                                                  (&local_578,
                                                   *(double *)((long)&p_Var5->_M_color + lVar22));
                                      }
                                      else {
                                        tinyusdz::value::Value::
                                        get_value<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                                                  ((
                                                  optional<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                                  *)local_2b0,
                                                  (Value *)((long)&p_Var5->_M_parent + lVar22),false
                                                  );
                                        bVar10 = local_2b0[0];
                                        local_498 = local_2b0[0];
                                        if (local_2b0[0] == true) {
                                          local_490._0_8_ = local_2b0._8_8_;
                                          local_490._8_8_ = local_2b0._16_8_;
                                          local_490._16_8_ = local_2b0._24_8_;
                                          local_2b0._8_8_ =
                                               (anon_struct_8_0_00000001_for___align)0x0;
                                          local_2b0._16_8_ = 0;
                                          local_2b0._24_8_ = 0;
                                          TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                          ::add_sample(&local_578,
                                                       *(double *)((long)&p_Var5->_M_color + lVar22)
                                                       ,(
                                                  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  *)local_490);
                                        }
                                        else {
                                          sStack_520 = 0;
                                          abStack_518[0] = false;
                                          abStack_518[1] = false;
                                          abStack_518[2] = false;
                                          abStack_518[3] = false;
                                          abStack_518[4] = false;
                                          abStack_518[5] = false;
                                          abStack_518[6] = false;
                                          abStack_518[7] = false;
                                          local_530 = (anon_struct_8_0_00000001_for___align)0x0;
                                          _Stack_528._M_p = (pointer)0x0;
                                          aStack_540._M_allocated_capacity = 0;
                                          aStack_540._8_8_ = 0;
                                          local_550[0] = false;
                                          local_550._1_3_ = 0;
                                          local_550._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                          local_550._8_8_ = (code *)0x0;
                                          local_508._12_4_ = 0;
                                        }
                                        if ((local_498 == true) &&
                                           ((anon_struct_8_0_00000001_for___align)local_490._0_8_ !=
                                            (anon_struct_8_0_00000001_for___align)0x0)) {
                                          operator_delete((void *)local_490._0_8_,
                                                          local_490._16_8_ - local_490._0_8_);
                                        }
                                        if (bVar10 == false) {
                                          local_558[0] = (fmt)(char)local_508._12_4_;
                                          goto LAB_0021c283;
                                        }
                                      }
                                      uVar23 = uVar23 + 1;
                                      lVar22 = lVar22 + 0x28;
                                    } while (uVar23 < (ulong)(((long)p_Var15[5]._M_left -
                                                               (long)p_Var15[5]._M_parent >> 3) *
                                                             -0x3333333333333333));
                                    local_558 = (undefined1  [8])
                                                ((ulong)local_558 & 0xffffffffffffff00);
                                  }
                                  local_558[0] = (fmt)0x1;
                                  local_550._0_8_ = local_598._M_dataplus._M_p;
                                  local_550._8_8_ =
                                       CONCAT62(local_598._M_string_length._2_6_,
                                                (undefined2)local_598._M_string_length);
                                  aStack_540._M_allocated_capacity =
                                       CONCAT62(local_598.field_2._M_allocated_capacity._2_6_,
                                                local_598.field_2._M_allocated_capacity._0_2_);
                                  local_598._M_dataplus._M_p = (pointer)0x0;
                                  local_598._M_string_length._0_2_ = 0;
                                  local_598._M_string_length._2_6_ = 0;
                                  local_598.field_2._M_allocated_capacity._0_2_ = 0;
                                  local_598.field_2._M_allocated_capacity._2_6_ = 0;
                                  aStack_540._8_2_ = local_598.field_2._8_2_;
                                  local_530 = (anon_struct_8_0_00000001_for___align)
                                              local_578._samples.
                                              super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                              ._M_impl.super__Vector_impl_data._M_start;
                                  _Stack_528._M_p =
                                       (pointer)CONCAT71(local_578._samples.
                                                                                                                  
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                                  local_578._samples.
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._0_1_);
                                  sStack_520 = CONCAT71(local_578._samples.
                                                                                                                
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_7_,local_578._samples.
                                                                                                                  
                                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_);
                                  local_578._samples.
                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                                  local_578._samples.
                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
                                  local_578._samples.
                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                  local_578._samples.
                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
                                  local_578._samples.
                                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
                                  abStack_518[0] = local_578._dirty;
                                }
                                else {
LAB_0021bfe7:
                                  local_558 = (undefined1  [8])
                                              ((ulong)local_558 & 0xffffffffffffff00);
                                  sStack_520 = 0;
                                  abStack_518[0] = false;
                                  abStack_518[1] = false;
                                  abStack_518[2] = false;
                                  abStack_518[3] = false;
                                  abStack_518[4] = false;
                                  abStack_518[5] = false;
                                  abStack_518[6] = false;
                                  abStack_518[7] = false;
                                  local_530 = (anon_struct_8_0_00000001_for___align)0x0;
                                  _Stack_528._M_p = (pointer)0x0;
                                  aStack_540._M_allocated_capacity = 0;
                                  aStack_540._8_8_ = 0;
                                  local_550[0] = false;
                                  local_550._1_3_ = 0;
                                  local_550._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                  local_550._8_8_ = (code *)0x0;
                                }
LAB_0021c283:
                                ::std::
                                vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>::Sample>_>
                                ::~vector(&local_578._samples);
                                if ((optional<tinyusdz::Interpolation>)local_598._M_dataplus._M_p !=
                                    (optional<tinyusdz::Interpolation>)0x0) {
                                  operator_delete(local_598._M_dataplus._M_p,
                                                  CONCAT62(local_598.field_2._M_allocated_capacity.
                                                           _2_6_,local_598.field_2.
                                                                 _M_allocated_capacity._0_2_) -
                                                  (long)local_598._M_dataplus._M_p);
                                }
                                local_438 = local_558[0];
                                if (local_558[0] == (fmt)0x1) {
                                  auStack_430 = (undefined1  [8])local_550._0_8_;
                                  local_428._0_8_ = local_550._8_8_;
                                  local_428._8_8_ = aStack_540._M_allocated_capacity;
                                  aStack_540._M_allocated_capacity = 0;
                                  local_550[0] = false;
                                  local_550._1_3_ = 0;
                                  local_550._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                  local_550._8_8_ = (code *)0x0;
                                  local_418 = aStack_540._8_2_;
                                  local_410._0_8_ = local_530;
                                  local_410._8_8_ = _Stack_528._M_p;
                                  local_410._16_8_ = sStack_520;
                                  sStack_520 = 0;
                                  local_530 = (anon_struct_8_0_00000001_for___align)0x0;
                                  _Stack_528._M_p = (pointer)0x0;
                                  local_410[0x18] = abStack_518[0];
                                  nonstd::optional_lite::detail::
                                  storage_t<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                                  ::destruct_value((
                                                  storage_t<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                                                  *)local_550);
                                }
                                fVar9 = local_438;
                                if (local_438 == (fmt)0x1) {
                                  nonstd::optional_lite::
                                  optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
                                  ::operator=((optional<tinyusdz::Animatable<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>>
                                               *)local_280._24_8_,
                                              (Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
                                               *)auStack_430);
                                }
                                else {
                                  local_5c0._0_4_ = 8;
                                  pPVar20 = (Property *)0x55;
                                  ::std::__cxx11::string::_M_replace
                                            ((ulong)(local_5c0 + 8),0,
                                             (char *)local_5b0._M_allocated_capacity,0x3bcf62);
                                }
                                if (local_438 == (fmt)0x1) {
                                  nonstd::optional_lite::detail::
                                  storage_t<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                                  ::destruct_value((
                                                  storage_t<tinyusdz::Animatable<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>_>
                                                  *)auStack_430);
                                }
                                if (fVar9 != (fmt)0x0) {
                                  AttrMetas::operator=
                                            ((AttrMetas *)local_4b0,(AttrMetas *)(p_Var15 + 7));
                                  ::std::
                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                  ::_M_insert_unique<std::__cxx11::string_const&>
                                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                              *)&local_4f0,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(local_490 + 0x18));
                                  local_5c0 = (undefined1  [8])
                                              ((ulong)local_5c0 & 0xffffffff00000000);
                                }
                                bVar24 = true;
                                bVar10 = false;
                              }
                              if (bVar10) {
                                if (p_Var15[6]._M_left != p_Var15[6]._M_parent) {
                                  AttrMetas::operator=
                                            ((AttrMetas *)local_4b0,(AttrMetas *)(p_Var15 + 7));
                                  __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_290;
                                  goto LAB_0021c413;
                                }
                                goto LAB_0021c420;
                              }
                              if (local_458._0_8_ != (long)local_458 + 0x10) {
                                operator_delete((void *)local_458._0_8_,local_458._16_8_ + 1);
                              }
                              if ((bVar24) ||
                                 (local_5b8 ==
                                  (anon_struct_8_0_00000001_for___align)((long)local_5c0 + 0x18)))
                              goto LAB_0021c445;
                              sVar17 = CONCAT71(local_5b0._9_7_,local_5b0._M_local_buf[8]);
                              aVar19 = local_5b8;
                            }
                            else {
                              local_5c0._0_4_ = 3;
                              ::std::__cxx11::stringstream::stringstream((stringstream *)&local_438)
                              ;
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_428,"Property type mismatch. ",0x18);
                              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)local_428,local_478._M_dataplus._M_p,
                                                   local_478._M_string_length);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12," expects type `",0xf);
                              tinyusdz::value::
                              TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                              ::type_name_abi_cxx11_();
                              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar12,(char *)local_558,local_550._0_8_);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        (poVar12,"` but defined as type `",0x17);
                              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar12,(char *)local_458._0_8_,local_458._8_8_);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"`",1);
                              if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                operator_delete((void *)local_558,(ulong)(local_550._8_8_ + 1));
                              }
                              ::std::__cxx11::stringbuf::str();
                              ::std::__cxx11::string::operator=
                                        ((string *)(local_5c0 + 8),(string *)local_558);
                              if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                operator_delete((void *)local_558,(ulong)(local_550._8_8_ + 1));
                              }
                              ::std::__cxx11::stringstream::~stringstream
                                        ((stringstream *)&local_438);
                              ::std::ios_base::~ios_base(local_3b8);
LAB_0021c420:
                              sVar17 = local_458._16_8_;
                              aVar19 = (anon_struct_8_0_00000001_for___align)local_458._0_8_;
                              if (local_458._0_8_ == (long)local_458 + 0x10) goto LAB_0021c445;
                            }
                            operator_delete((void *)aVar19,sVar17 + 1);
                          }
LAB_0021c445:
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_478._M_dataplus._M_p != &local_478.field_2) {
                            operator_delete(local_478._M_dataplus._M_p,
                                            local_478.field_2._M_allocated_capacity + 1);
                          }
                          if ((undefined1 *)local_290._0_8_ != local_280) {
                            operator_delete((void *)local_290._0_8_,local_280._0_8_ + 1);
                          }
                          iVar11 = 0;
                          if (((ulong)local_5c0 & 0xfffffffd) == 0) {
                            iVar11 = 3;
LAB_0021c683:
                            bVar10 = false;
                          }
                          else {
                            bVar10 = true;
                            if (local_5c0._0_4_ != 1) {
                              ::std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)&local_438);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_438,"[error]",7);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_438,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         ,0x5a);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_438,":",1);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_438,"ReconstructPrim",0xf);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_438,"():",3);
                              poVar12 = (ostream *)
                                        ::std::ostream::operator<<((Property *)&local_438,0xefe);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                              local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_598,
                                         "Parsing attribute `{}` failed. Error: {}","");
                              fmt::format<char[15],std::__cxx11::string>
                                        ((string *)local_558,(fmt *)&local_598,
                                         (string *)"clippingPlanes",(char (*) [15])(local_5c0 + 8),
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)pPVar20);
                              poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&local_438,(char *)local_558,
                                                   local_550._0_8_);
                              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
                              if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                operator_delete((void *)local_558,(ulong)(local_550._8_8_ + 1));
                              }
                              uVar16 = abStack_518._8_8_;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_598._M_dataplus._M_p != &local_598.field_2) {
                                operator_delete(local_598._M_dataplus._M_p,
                                                CONCAT62(local_598.field_2._M_allocated_capacity.
                                                         _2_6_,local_598.field_2.
                                                               _M_allocated_capacity._0_2_) + 1);
                              }
                              if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                   *)uVar16 !=
                                  (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                   *)0x0) {
                                ::std::__cxx11::stringbuf::str();
                                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_558,&local_598,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)uVar16);
                                ::std::__cxx11::string::operator=
                                          ((string *)uVar16,(string *)local_558);
                                if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                  operator_delete((void *)local_558,(ulong)(local_550._8_8_ + 1));
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_598._M_dataplus._M_p != &local_598.field_2) {
                                  operator_delete(local_598._M_dataplus._M_p,
                                                  CONCAT62(local_598.field_2._M_allocated_capacity.
                                                           _2_6_,local_598.field_2.
                                                                 _M_allocated_capacity._0_2_) + 1);
                                }
                              }
                              ::std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)&local_438);
                              ::std::ios_base::~ios_base(local_3c8);
                              iVar11 = 1;
                              goto LAB_0021c683;
                            }
                          }
                          if (local_5b8 !=
                              (anon_struct_8_0_00000001_for___align)((long)local_5c0 + 0x18)) {
                            operator_delete((void *)local_5b8,
                                            CONCAT71(local_5b0._9_7_,local_5b0._M_local_buf[8]) + 1)
                            ;
                          }
                          if (bVar10) {
                            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                            ::std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_1d8,*(long *)(p_Var15 + 1),
                                       (long)&(p_Var15[1]._M_parent)->_M_color +
                                       *(long *)(p_Var15 + 1));
                            _local_438 = local_428;
                            ::std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_438,"shutter:open","");
                            pPVar20 = (Property *)&local_438;
                            anon_unknown_0::ParseTypedAttribute<double>
                                      ((ParseResult *)local_558,
                                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)&local_4f0,&local_1d8,(Property *)local_508.dynamic,
                                       (string *)&local_438,local_250);
                            if ((undefined1 *)_local_438 != local_428) {
                              operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                              operator_delete(local_1d8._M_dataplus._M_p,
                                              (ulong)(local_1d8.field_2._M_allocated_capacity + 1));
                            }
                            iVar11 = 0;
                            if (((ulong)local_558 & 0xfffffffd) == 0) {
                              iVar11 = 3;
LAB_0021c942:
                              bVar10 = false;
                            }
                            else {
                              bVar10 = true;
                              if (local_558._0_4_ != Unmatched) {
                                ::std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)&local_438);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&local_438,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&local_438,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           ,0x5a);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&local_438,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&local_438,"ReconstructPrim",0xf);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&local_438,"():",3);
                                poVar12 = (ostream *)
                                          ::std::ostream::operator<<((Property *)&local_438,0xeff);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
                                pcVar2 = local_5c0 + 0x10;
                                local_5c0 = (undefined1  [8])pcVar2;
                                ::std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_5c0,
                                           "Parsing attribute `{}` failed. Error: {}","");
                                fmt::format<char[13],std::__cxx11::string>
                                          (&local_598,(fmt *)local_5c0,(string *)"shutter:open",
                                           (char (*) [13])local_550,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)pPVar20);
                                poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&local_438,
                                                     local_598._M_dataplus._M_p,
                                                     CONCAT62(local_598._M_string_length._2_6_,
                                                              (undefined2)local_598._M_string_length
                                                             ));
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1)
                                ;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_598._M_dataplus._M_p != &local_598.field_2) {
                                  operator_delete(local_598._M_dataplus._M_p,
                                                  CONCAT62(local_598.field_2._M_allocated_capacity.
                                                           _2_6_,local_598.field_2.
                                                                 _M_allocated_capacity._0_2_) + 1);
                                }
                                uVar16 = abStack_518._8_8_;
                                if (local_5c0 != (undefined1  [8])pcVar2) {
                                  operator_delete((void *)local_5c0,
                                                  (ulong)(local_5b0._M_allocated_capacity + 1));
                                }
                                if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                     *)uVar16 !=
                                    (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                     *)0x0) {
                                  ::std::__cxx11::stringbuf::str();
                                  ::std::operator+(&local_598,
                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5c0,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)uVar16);
                                  ::std::__cxx11::string::operator=
                                            ((string *)uVar16,(string *)&local_598);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_598._M_dataplus._M_p != &local_598.field_2) {
                                    operator_delete(local_598._M_dataplus._M_p,
                                                    CONCAT62(local_598.field_2._M_allocated_capacity
                                                             ._2_6_,local_598.field_2.
                                                                    _M_allocated_capacity._0_2_) + 1
                                                   );
                                  }
                                  if (local_5c0 != (undefined1  [8])pcVar2) {
                                    operator_delete((void *)local_5c0,
                                                    (ulong)(local_5b0._M_allocated_capacity + 1));
                                  }
                                }
                                ::std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)&local_438);
                                ::std::ios_base::~ios_base(local_3c8);
                                iVar11 = 1;
                                goto LAB_0021c942;
                              }
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_550._0_8_ != &aStack_540) {
                              operator_delete((void *)local_550._0_8_,
                                              (ulong)(aStack_540._M_allocated_capacity + 1));
                            }
                            if (bVar10) {
                              local_1f8._0_8_ = (long)local_1f8 + 0x10;
                              ::std::__cxx11::string::_M_construct<char*>
                                        ((string *)local_1f8,*(long *)(p_Var15 + 1),
                                         (long)&(p_Var15[1]._M_parent)->_M_color +
                                         *(long *)(p_Var15 + 1));
                              _local_438 = local_428;
                              ::std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_438,"shutter:close","");
                              pPVar20 = (Property *)&local_438;
                              anon_unknown_0::ParseTypedAttribute<double>
                                        ((ParseResult *)local_558,
                                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)&local_4f0,(string *)local_1f8,
                                         (Property *)local_508.dynamic,(string *)&local_438,
                                         (TypedAttributeWithFallback<tinyusdz::Animatable<double>_>
                                          *)local_280._32_8_);
                              if ((undefined1 *)_local_438 != local_428) {
                                operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1));
                              }
                              if (local_1f8._0_8_ != (long)local_1f8 + 0x10) {
                                operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                              }
                              iVar11 = 0;
                              if (((ulong)local_558 & 0xfffffffd) == 0) {
                                iVar11 = 3;
LAB_0021cc07:
                                bVar10 = false;
                              }
                              else {
                                bVar10 = true;
                                if (local_558._0_4_ != Unmatched) {
                                  ::std::__cxx11::ostringstream::ostringstream
                                            ((ostringstream *)&local_438);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&local_438,"[error]",7);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&local_438,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                             ,0x5a);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&local_438,":",1);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&local_438,"ReconstructPrim",0xf);
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&local_438,"():",3);
                                  poVar12 = (ostream *)
                                            ::std::ostream::operator<<((Property *)&local_438,0xf01)
                                  ;
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12," ",1);
                                  pcVar2 = local_5c0 + 0x10;
                                  local_5c0 = (undefined1  [8])pcVar2;
                                  ::std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_5c0,
                                             "Parsing attribute `{}` failed. Error: {}","");
                                  fmt::format<char[14],std::__cxx11::string>
                                            (&local_598,(fmt *)local_5c0,(string *)"shutter:close",
                                             (char (*) [14])local_550,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)pPVar20);
                                  poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&local_438,
                                                       local_598._M_dataplus._M_p,
                                                       CONCAT62(local_598._M_string_length._2_6_,
                                                                (undefined2)
                                                                local_598._M_string_length));
                                  ::std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12,"\n",1);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_598._M_dataplus._M_p != &local_598.field_2) {
                                    operator_delete(local_598._M_dataplus._M_p,
                                                    CONCAT62(local_598.field_2._M_allocated_capacity
                                                             ._2_6_,local_598.field_2.
                                                                    _M_allocated_capacity._0_2_) + 1
                                                   );
                                  }
                                  uVar16 = abStack_518._8_8_;
                                  if (local_5c0 != (undefined1  [8])pcVar2) {
                                    operator_delete((void *)local_5c0,
                                                    (ulong)(local_5b0._M_allocated_capacity + 1));
                                  }
                                  if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                       *)uVar16 !=
                                      (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                       *)0x0) {
                                    ::std::__cxx11::stringbuf::str();
                                    ::std::operator+(&local_598,
                                                     (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_5c0,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)uVar16);
                                    ::std::__cxx11::string::operator=
                                              ((string *)uVar16,(string *)&local_598);
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_598._M_dataplus._M_p != &local_598.field_2) {
                                      operator_delete(local_598._M_dataplus._M_p,
                                                      CONCAT62(local_598.field_2.
                                                               _M_allocated_capacity._2_6_,
                                                               local_598.field_2.
                                                               _M_allocated_capacity._0_2_) + 1);
                                    }
                                    if (local_5c0 != (undefined1  [8])pcVar2) {
                                      operator_delete((void *)local_5c0,
                                                      (ulong)(local_5b0._M_allocated_capacity + 1));
                                    }
                                  }
                                  ::std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)&local_438);
                                  ::std::ios_base::~ios_base(local_3c8);
                                  iVar11 = 1;
                                  goto LAB_0021cc07;
                                }
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_550._0_8_ != &aStack_540) {
                                operator_delete((void *)local_550._0_8_,
                                                (ulong)(aStack_540._M_allocated_capacity + 1));
                              }
                              if (bVar10) {
                                p_Var5 = p_Var15 + 1;
                                iVar11 = ::std::__cxx11::string::compare((char *)p_Var5);
                                if (iVar11 == 0) {
                                  _local_438 = local_428;
                                  ::std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_438,"projection","");
                                  cVar14 = ::std::
                                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_4f0,(key_type *)&local_438);
                                  if ((undefined1 *)_local_438 != local_428) {
                                    operator_delete((void *)_local_438,(ulong)(local_428._0_8_ + 1))
                                    ;
                                  }
                                  iVar11 = 3;
                                  if ((_Rb_tree_header *)cVar14._M_node ==
                                      &local_4f0._M_impl.super__Rb_tree_header) {
                                    if (((ulong)p_Var15[0x17]._M_parent & 0xfffffffe00000000) ==
                                        0x200000000) {
                                      _local_438 = local_428;
                                      auStack_430[0] = false;
                                      auStack_430._1_3_ = 0;
                                      auStack_430._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                      local_428._0_8_ = local_428._0_8_ & 0xffffffffffffff00;
                                    }
                                    else {
                                      Attribute::type_name_abi_cxx11_
                                                ((string *)&local_438,(Attribute *)local_508.dynamic
                                                );
                                    }
                                    local_558 = (undefined1  [8])(local_550 + 8);
                                    local_550[0] = true;
                                    local_550._1_3_ = 0;
                                    local_550._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                    local_550._8_6_ = 0x6e656b6f74;
                                    if ((((optional<tinyusdz::Interpolation>)auStack_430 ==
                                          (optional<tinyusdz::Interpolation>)0x5) &&
                                        (iVar11 = bcmp((void *)_local_438,local_550 + 8,5),
                                        iVar11 == 0)) &&
                                       (uVar4 = *(uint *)((long)&p_Var15[0x17]._M_parent + 4),
                                       uVar4 < 2)) {
                                      if ((undefined1 *)_local_438 != local_428) {
                                        operator_delete((void *)_local_438,
                                                        (ulong)(local_428._0_8_ + 1));
                                      }
                                      if (uVar4 == 0) {
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)&local_438);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&local_438,"[warn]",6);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&local_438,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  ,0x5a);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&local_438,":",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&local_438,"ReconstructPrim",0xf);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&local_438,"():",3);
                                        poVar12 = (ostream *)
                                                  ::std::ostream::operator<<
                                                            ((Property *)&local_438,0xf03);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar12," ",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&local_438,"No value assigned to `",
                                                   0x16);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&local_438,"projection",10);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&local_438,
                                                   "` token attribute. Set default token value.",
                                                   0x2b);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&local_438,"\n",1);
                                        if (local_4f8 != (vtable_type *)0x0) {
                                          ::std::__cxx11::stringbuf::str();
                                          ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_558,&local_598,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)abStack_518._8_8_);
                                          ::std::__cxx11::string::operator=
                                                    ((string *)local_4f8,(string *)local_558);
                                          if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                            operator_delete((void *)local_558,
                                                            (ulong)(local_550._8_8_ + 1));
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_598._M_dataplus._M_p != &local_598.field_2) {
                                            operator_delete(local_598._M_dataplus._M_p,
                                                            CONCAT62(local_598.field_2.
                                                                     _M_allocated_capacity._2_6_,
                                                                     local_598.field_2.
                                                                     _M_allocated_capacity._0_2_) +
                                                            1);
                                          }
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)&local_438);
                                        ::std::ios_base::~ios_base(local_3c8);
                                        AttrMetas::operator=
                                                  (&local_4b8->_metas,(AttrMetas *)(p_Var15 + 7));
                                        pcVar18 = "projection";
                                        pcVar6 = "projection";
LAB_0021d639:
                                        iVar11 = 3;
                                        _local_438 = local_428;
                                        ::std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_438,pcVar18,pcVar6 + 10);
                                        ::std::
                                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        ::_M_insert_unique<std::__cxx11::string>
                                                  ((
                                                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&local_4f0,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&local_438);
                                        if ((undefined1 *)_local_438 != local_428) {
                                          operator_delete((void *)_local_438,
                                                          (ulong)(local_428._0_8_ + 1));
                                        }
                                        goto LAB_0021d83a;
                                      }
                                    }
                                    else if ((undefined1 *)_local_438 != local_428) {
                                      operator_delete((void *)_local_438,
                                                      (ulong)(local_428._0_8_ + 1));
                                    }
                                    _local_438 = (pointer)0x0;
                                    auStack_430[0] = false;
                                    auStack_430._1_3_ = 0;
                                    auStack_430._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                    local_428._8_8_ =
                                         ::std::
                                         _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3765:28)>
                                         ::_M_invoke;
                                    local_428._0_8_ =
                                         ::std::
                                         _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomCamera::Projection,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3765:28)>
                                         ::_M_manager;
                                    local_558 = (undefined1  [8])(local_550 + 8);
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)local_558,"projection","");
                                    bVar10 = options->strict_allowedToken_check;
                                    local_58._16_8_ = (code *)0x0;
                                    local_58._24_8_ = (code *)0x0;
                                    local_58.data.__align =
                                         (anon_struct_8_0_00000001_for___align)0x0;
                                    local_58._8_8_ = 0;
                                    if ((code *)local_428._0_8_ != (code *)0x0) {
                                      (*(code *)local_428._0_8_)(&local_58,(Property *)&local_438,2)
                                      ;
                                      local_58._16_8_ = local_428._0_8_;
                                      local_58._24_8_ = local_428._8_8_;
                                    }
                                    target = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                              *)abStack_518._8_8_;
                                    bVar10 = ParseTimeSampledEnumProperty<tinyusdz::GeomCamera::Projection,tinyusdz::GeomCamera::Projection>
                                                       ((string *)local_558,bVar10,
                                                        (
                                                  EnumHandlerFun<tinyusdz::GeomCamera::Projection> *
                                                  )&local_58,(Attribute *)local_508.dynamic,
                                                  local_4b8,(string *)local_4f8,
                                                  (string *)abStack_518._8_8_);
                                    if ((code *)local_58._16_8_ != (code *)0x0) {
                                      (*(code *)local_58._16_8_)(&local_58,&local_58,3);
                                    }
                                    if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                      operator_delete((void *)local_558,(ulong)(local_550._8_8_ + 1)
                                                     );
                                    }
                                    iVar11 = 1;
                                    if (bVar10) {
                                      AttrMetas::operator=
                                                (&local_4b8->_metas,(AttrMetas *)(p_Var15 + 7));
                                      pcVar18 = "projection";
                                      pcVar6 = "projection";
LAB_0021d7eb:
                                      local_558 = (undefined1  [8])(local_550 + 8);
                                      ::std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_558,pcVar18,pcVar6 + 10);
                                      ::std::
                                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      ::_M_insert_unique<std::__cxx11::string>
                                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&local_4f0,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_558);
                                      if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                        operator_delete((void *)local_558,
                                                        (ulong)(local_550._8_8_ + 1));
                                      }
                                      iVar11 = 3;
                                    }
LAB_0021d820:
                                    if ((code *)local_428._0_8_ != (code *)0x0) {
                                      (*(code *)local_428._0_8_)
                                                ((Property *)&local_438,(Property *)&local_438,3);
                                    }
                                  }
                                }
                                else {
                                  iVar11 = ::std::__cxx11::string::compare((char *)p_Var5);
                                  p_Var3 = &local_4f0._M_impl.super__Rb_tree_header;
                                  if (iVar11 == 0) {
                                    _local_438 = local_428;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_438,"stereoRole","");
                                    cVar14 = ::std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_4f0,(key_type *)&local_438);
                                    if ((undefined1 *)_local_438 != local_428) {
                                      operator_delete((void *)_local_438,
                                                      (ulong)(local_428._0_8_ + 1));
                                    }
                                    iVar11 = 3;
                                    if ((_Rb_tree_header *)cVar14._M_node == p_Var3) {
                                      if (((ulong)p_Var15[0x17]._M_parent & 0xfffffffe00000000) ==
                                          0x200000000) {
                                        _local_438 = local_428;
                                        auStack_430[0] = false;
                                        auStack_430._1_3_ = 0;
                                        auStack_430._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                        local_428._0_8_ = local_428._0_8_ & 0xffffffffffffff00;
                                      }
                                      else {
                                        Attribute::type_name_abi_cxx11_
                                                  ((string *)&local_438,
                                                   (Attribute *)local_508.dynamic);
                                      }
                                      local_558 = (undefined1  [8])(local_550 + 8);
                                      local_550[0] = true;
                                      local_550._1_3_ = 0;
                                      local_550._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                      local_550._8_6_ = 0x6e656b6f74;
                                      if ((((optional<tinyusdz::Interpolation>)auStack_430 ==
                                            (optional<tinyusdz::Interpolation>)0x5) &&
                                          (iVar11 = bcmp((void *)_local_438,local_550 + 8,5),
                                          iVar11 == 0)) &&
                                         (uVar4 = *(uint *)((long)&p_Var15[0x17]._M_parent + 4),
                                         uVar4 < 2)) {
                                        if ((undefined1 *)_local_438 != local_428) {
                                          operator_delete((void *)_local_438,
                                                          (ulong)(local_428._0_8_ + 1));
                                        }
                                        if (uVar4 == 0) {
                                          ::std::__cxx11::ostringstream::ostringstream
                                                    ((ostringstream *)&local_438);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&local_438,"[warn]",6);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&local_438,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  ,0x5a);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&local_438,":",1);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&local_438,"ReconstructPrim",0xf);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&local_438,"():",3);
                                          poVar12 = (ostream *)
                                                    ::std::ostream::operator<<
                                                              ((Property *)&local_438,0xf05);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar12," ",1);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&local_438,"No value assigned to `",
                                                     0x16);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&local_438,"stereoRole",10);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&local_438,
                                                     "` token attribute. Set default token value.",
                                                     0x2b);
                                          ::std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&local_438,"\n",1);
                                          if (local_4f8 != (vtable_type *)0x0) {
                                            ::std::__cxx11::stringbuf::str();
                                            ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_558,&local_598,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)abStack_518._8_8_);
                                            ::std::__cxx11::string::operator=
                                                      ((string *)local_4f8,(string *)local_558);
                                            if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                              operator_delete((void *)local_558,
                                                              (ulong)(local_550._8_8_ + 1));
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_598._M_dataplus._M_p != &local_598.field_2)
                                            {
                                              operator_delete(local_598._M_dataplus._M_p,
                                                              CONCAT62(local_598.field_2.
                                                                       _M_allocated_capacity._2_6_,
                                                                       local_598.field_2.
                                                                       _M_allocated_capacity._0_2_)
                                                              + 1);
                                            }
                                          }
                                          ::std::__cxx11::ostringstream::~ostringstream
                                                    ((ostringstream *)&local_438);
                                          ::std::ios_base::~ios_base(local_3c8);
                                          AttrMetas::operator=
                                                    (&local_4c0->_metas,(AttrMetas *)(p_Var15 + 7));
                                          pcVar18 = "stereoRole";
                                          pcVar6 = "stereoRole";
                                          goto LAB_0021d639;
                                        }
                                      }
                                      else if ((undefined1 *)_local_438 != local_428) {
                                        operator_delete((void *)_local_438,
                                                        (ulong)(local_428._0_8_ + 1));
                                      }
                                      _local_438 = (pointer)0x0;
                                      auStack_430[0] = false;
                                      auStack_430._1_3_ = 0;
                                      auStack_430._4_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
                                      local_428._8_8_ =
                                           ::std::
                                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3790:28)>
                                           ::_M_invoke;
                                      local_428._0_8_ =
                                           ::std::
                                           _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomCamera::StereoRole,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3790:28)>
                                           ::_M_manager;
                                      local_558 = (undefined1  [8])(local_550 + 8);
                                      ::std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)local_558,"stereoRole","");
                                      bVar10 = options->strict_allowedToken_check;
                                      local_78._16_8_ = (code *)0x0;
                                      local_78._24_8_ = (code *)0x0;
                                      local_78._0_8_ = (void *)0x0;
                                      local_78._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
                                      if ((code *)local_428._0_8_ != (code *)0x0) {
                                        (*(code *)local_428._0_8_)
                                                  ((EnumHandlerFun<tinyusdz::GeomCamera::StereoRole>
                                                    *)local_78,(Property *)&local_438,2);
                                        local_78._16_8_ = local_428._0_8_;
                                        local_78._24_8_ = local_428._8_8_;
                                      }
                                      target = (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                                *)abStack_518._8_8_;
                                      bVar10 = ParseUniformEnumProperty<tinyusdz::GeomCamera::StereoRole,tinyusdz::GeomCamera::StereoRole>
                                                         ((string *)local_558,bVar10,
                                                          (
                                                  EnumHandlerFun<tinyusdz::GeomCamera::StereoRole> *
                                                  )local_78,(Attribute *)local_508.dynamic,local_4c0
                                                  ,(string *)local_4f8,(string *)abStack_518._8_8_);
                                      if ((code *)local_78._16_8_ != (code *)0x0) {
                                        (*(code *)local_78._16_8_)
                                                  ((EnumHandlerFun<tinyusdz::GeomCamera::StereoRole>
                                                    *)local_78,
                                                   (EnumHandlerFun<tinyusdz::GeomCamera::StereoRole>
                                                    *)local_78,3);
                                      }
                                      if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                        operator_delete((void *)local_558,
                                                        (ulong)(local_550._8_8_ + 1));
                                      }
                                      iVar11 = 1;
                                      if (bVar10) {
                                        AttrMetas::operator=
                                                  (&local_4c0->_metas,(AttrMetas *)(p_Var15 + 7));
                                        pcVar18 = "stereoRole";
                                        pcVar6 = "stereoRole";
                                        goto LAB_0021d7eb;
                                      }
                                      goto LAB_0021d820;
                                    }
                                  }
                                  else {
                                    cVar14 = ::std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_4f0,(key_type *)p_Var5);
                                    if ((_Rb_tree_header *)cVar14._M_node == p_Var3) {
                                      this = ::std::
                                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                             ::operator[]((
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                                  *)local_280._16_8_,(key_type *)p_Var5);
                                      Property::operator=(this,(Property *)local_508.dynamic);
                                      ::std::
                                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                      ::_M_insert_unique<std::__cxx11::string_const&>
                                                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                                  *)&local_4f0,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var5);
                                    }
                                    cVar14 = ::std::
                                             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ::find((
                                                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)&local_4f0,(key_type *)p_Var5);
                                    iVar11 = 0;
                                    if ((_Rb_tree_header *)cVar14._M_node == p_Var3) {
                                      ::std::__cxx11::ostringstream::ostringstream
                                                ((ostringstream *)&local_438);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&local_438,"[error]",7);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&local_438,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                 ,0x5a);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&local_438,":",1);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&local_438,"ReconstructPrim",0xf);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&local_438,"():",3);
                                      poVar12 = (ostream *)
                                                ::std::ostream::operator<<
                                                          ((Property *)&local_438,0xf07);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar12," ",1);
                                      ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_558,"Unsupported/unimplemented property: "
                                                  ,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)p_Var5);
                                      poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&local_438,(char *)local_558,
                                                           local_550._0_8_);
                                      ::std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar12,"\n",1);
                                      if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                        operator_delete((void *)local_558,
                                                        (ulong)(local_550._8_8_ + 1));
                                      }
                                      uVar16 = abStack_518._8_8_;
                                      if ((TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                           *)abStack_518._8_8_ !=
                                          (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>
                                           *)0x0) {
                                        ::std::__cxx11::stringbuf::str();
                                        ::std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_558,&local_598,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)uVar16);
                                        ::std::__cxx11::string::operator=
                                                  ((string *)uVar16,(string *)local_558);
                                        if (local_558 != (undefined1  [8])(local_550 + 8)) {
                                          operator_delete((void *)local_558,
                                                          (ulong)(local_550._8_8_ + 1));
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_598._M_dataplus._M_p != &local_598.field_2) {
                                          operator_delete(local_598._M_dataplus._M_p,
                                                          CONCAT62(local_598.field_2.
                                                                   _M_allocated_capacity._2_6_,
                                                                   local_598.field_2.
                                                                   _M_allocated_capacity._0_2_) + 1)
                                          ;
                                        }
                                      }
                                      ::std::__cxx11::ostringstream::~ostringstream
                                                ((ostringstream *)&local_438);
                                      ::std::ios_base::~ios_base(local_3c8);
                                      iVar11 = 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_0021d83a:
        if ((iVar11 != 3) && (iVar11 != 0)) break;
        p_Var15 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15);
        local_4a0._1_7_ = (undefined7)((ulong)p_Var15 >> 8);
        local_4a0._0_1_ = p_Var15 == (_Base_ptr)local_208._8_8_;
      } while (p_Var15 != (_Base_ptr)local_208._8_8_);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_4f0,(_Link_type)local_4f0._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)(SUB81(local_4a0,0) & 1);
}

Assistant:

bool ReconstructPrim<GeomCamera>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomCamera *camera,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)references;
  (void)warn;
  (void)options;

  auto ProjectionHandler = [](const std::string &tok)
      -> nonstd::expected<GeomCamera::Projection, std::string> {
    using EnumTy = std::pair<GeomCamera::Projection, const char *>;
    constexpr std::array<EnumTy, 2> enums = {
        std::make_pair(GeomCamera::Projection::Perspective, "perspective"),
        std::make_pair(GeomCamera::Projection::Orthographic, "orthographic"),
    };

    auto ret =
        CheckAllowedTokens<GeomCamera::Projection, enums.size()>(enums, tok);
    if (!ret) {
      return nonstd::make_unexpected(ret.error());
    }

    for (auto &item : enums) {
      if (tok == item.second) {
        return item.first;
      }
    }

    // Should never reach here, though.
    return nonstd::make_unexpected(
        quote(tok) + " is invalid token for `projection` propety");
  };

  auto StereoRoleHandler = [](const std::string &tok)
      -> nonstd::expected<GeomCamera::StereoRole, std::string> {
    using EnumTy = std::pair<GeomCamera::StereoRole, const char *>;
    constexpr std::array<EnumTy, 3> enums = {
        std::make_pair(GeomCamera::StereoRole::Mono, "mono"),
        std::make_pair(GeomCamera::StereoRole::Left, "left"),
        std::make_pair(GeomCamera::StereoRole::Right, "right"),
    };

    auto ret =
        CheckAllowedTokens<GeomCamera::StereoRole, enums.size()>(enums, tok);
    if (!ret) {
      return nonstd::make_unexpected(ret.error());
    }

    for (auto &item : enums) {
      if (tok == item.second) {
        return item.first;
      }
    }

    // Should never reach here, though.
    return nonstd::make_unexpected(
        quote(tok) + " is invalid token for `stereoRole` propety");
  };

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, camera, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "focalLength", GeomCamera, camera->focalLength)
    PARSE_TYPED_ATTRIBUTE(table, prop, "focusDistance", GeomCamera,
                   camera->focusDistance)
    PARSE_TYPED_ATTRIBUTE(table, prop, "exposure", GeomCamera, camera->exposure)
    PARSE_TYPED_ATTRIBUTE(table, prop, "fStop", GeomCamera, camera->fStop)
    PARSE_TYPED_ATTRIBUTE(table, prop, "horizontalAperture", GeomCamera,
                   camera->horizontalAperture)
    PARSE_TYPED_ATTRIBUTE(table, prop, "horizontalApertureOffset", GeomCamera,
                   camera->horizontalApertureOffset)
    PARSE_TYPED_ATTRIBUTE(table, prop, "verticalAperture", GeomCamera,
                   camera->verticalAperture)
    PARSE_TYPED_ATTRIBUTE(table, prop, "verticalApertureOffset", GeomCamera,
                   camera->verticalApertureOffset)
    PARSE_TYPED_ATTRIBUTE(table, prop, "clippingRange", GeomCamera,
                   camera->clippingRange)
    PARSE_TYPED_ATTRIBUTE(table, prop, "clippingPlanes", GeomCamera,
                   camera->clippingPlanes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "shutter:open", GeomCamera, camera->shutterOpen)
    PARSE_TYPED_ATTRIBUTE(table, prop, "shutter:close", GeomCamera,
                   camera->shutterClose)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "projection", GeomCamera::Projection, ProjectionHandler, GeomCamera,
                       camera->projection, options.strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "stereoRole", GeomCamera::StereoRole, StereoRoleHandler, GeomCamera,
                       camera->stereoRole, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomCamera, camera->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}